

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

UnlocalizedNumberFormatter * __thiscall
icu_63::number::UnlocalizedNumberFormatter::operator=(UnlocalizedNumberFormatter *this,UNF *src)

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.notation
  .fUnion.scientific.fExponentSignDisplay =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       notation.fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
    notation = *(undefined8 *)
                &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                 fMacros.notation;
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unit,
             &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unit);
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.perUnit,
             &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.perUnit);
  pPVar7 = &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
            .precision;
  pPVar8 = &(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
            fMacros.precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  integerWidth.fHasError =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       integerWidth.fHasError;
  *(undefined4 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .integerWidth.fUnion + 4) =
       *(undefined4 *)
        ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                fMacros.integerWidth.fUnion + 4);
  impl::SymbolsWrapper::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.symbols,
             &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.symbols);
  UVar5 = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
          sign;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  unitWidth = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
              fMacros.unitWidth;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.sign =
       UVar5;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.decimal
       = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
         decimal;
  Scale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                    ).fMacros.scale,
                   &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>)
                    .fMacros.scale);
  pPVar1 = (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           rules;
  uVar2 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                   fMacros.rules + 4);
  uVar3 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                   fMacros.currencySymbols + 4);
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
  affixProvider =
       (src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
       affixProvider;
  (this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.rules =
       pPVar1;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .rules + 4) = uVar2;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros
           .currencySymbols + 4) = uVar3;
  Locale::operator=(&(this->
                     super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                     fMacros.locale,
                    &(src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                     ).fMacros.locale);
  return this;
}

Assistant:

UnlocalizedNumberFormatter& UnlocalizedNumberFormatter::operator=(UNF&& src) U_NOEXCEPT {
    NFS<UNF>::operator=(static_cast<NFS<UNF>&&>(src));
    // No additional fields to assign
    return *this;
}